

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall
Arithmetic_Associativity_Test::Arithmetic_Associativity_Test(Arithmetic_Associativity_Test *this)

{
  Arithmetic_Associativity_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Arithmetic_Associativity_Test_00243de0;
  return;
}

Assistant:

TEST(Arithmetic, Associativity) {
	MockParser mock(
		"let a = 3\n"
		"let b = 4\n"
		"let c = 5\n"
		"let d = a + b + c\n"
		"let e = a * b * c * d\n"
	);

	INS2(BC_SET_N, 0, 0);
	INS2(BC_SET_N, 1, 1);
	INS2(BC_SET_N, 2, 2);

	INS(BC_ADD_LL, 3, 0, 1);
	INS(BC_ADD_LL, 3, 3, 2);

	INS(BC_MUL_LL, 4, 0, 1);
	INS(BC_MUL_LL, 4, 4, 2);
	INS(BC_MUL_LL, 4, 4, 3);

	INS(BC_RET, 0, 0, 0);
}